

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* generateResults(RestCommand command,string *brokerName,string_view target,string_view query,
                 flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                 *fields)

{
  string_view timeString;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  string_view brokerName_00;
  string_view brokerName_01;
  string_view brokerName_02;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *pfVar6;
  element_type *peVar7;
  size_type sVar8;
  size_t in_RCX;
  mapped_type in_ESI;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  char *in_R8;
  char *in_R9;
  undefined4 uStack0000000000000008;
  undefined4 uStack000000000000000c;
  undefined4 uStack0000000000000010;
  undefined4 uStack0000000000000014;
  string res;
  bool autoquery;
  TimeRepresentation<count_time<9,_long>_> bTime;
  json retJson;
  string type;
  bool useUuid;
  string errorMessage;
  shared_ptr<helics::Broker> brkr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cmdstr;
  undefined4 in_stack_fffffffffffff738;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff73c;
  undefined7 in_stack_fffffffffffff740;
  undefined1 in_stack_fffffffffffff747;
  key_type *in_stack_fffffffffffff748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff768;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff770;
  char *in_stack_fffffffffffff778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff790;
  char (*in_stack_fffffffffffff7a0) [12];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *in_stack_fffffffffffff7a8;
  size_t in_stack_fffffffffffff7b0;
  char *in_stack_fffffffffffff7b8;
  char *pcVar10;
  bool local_7c9;
  bool local_7a9;
  undefined8 local_758;
  undefined8 local_750;
  undefined1 local_730 [36];
  undefined4 local_70c;
  undefined4 local_708;
  undefined4 uStack_704;
  undefined4 uStack_700;
  undefined4 uStack_6fc;
  size_t local_6f8;
  char *pcStack_6f0;
  undefined1 local_6e8 [32];
  size_t local_6c8;
  char *local_6c0;
  size_t local_6b8;
  char *local_6b0;
  size_t local_6a8;
  char *local_6a0;
  __sv_type local_698;
  __sv_type local_688;
  undefined4 local_654;
  byte local_639;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_620;
  undefined4 local_61c;
  undefined4 local_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  size_t local_608;
  char *pcStack_600;
  allocator<char> local_5e9 [33];
  __sv_type local_5c8;
  size_t local_5b8;
  char *pcStack_5b0;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_5a0;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_598;
  undefined4 local_58c;
  undefined4 local_574;
  baseType local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_561;
  __sv_type local_540;
  TimeRepresentation<count_time<9,_long>_> local_530;
  undefined4 local_524;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_520;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_518;
  undefined4 local_50c;
  undefined4 local_4f4;
  undefined4 local_4cc;
  undefined4 local_4a4;
  undefined4 local_45c;
  byte local_3b9;
  undefined4 local_394;
  undefined4 local_370;
  allocator<char> local_369 [33];
  __sv_type local_348;
  __sv_type local_328;
  __sv_type local_318;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_308;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_300;
  __sv_type local_2f8;
  size_t local_2d8;
  char *pcStack_2d0;
  __shared_ptr local_2b8 [8];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  allocator<char> local_239 [33];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_218;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_210;
  allocator<char> local_201 [33];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_1e0;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_1d8;
  allocator<char> local_1c9 [33];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_1a8;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_1a0;
  allocator<char> local_191 [33];
  __sv_type local_170;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_160;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_158;
  allocator<char> local_149 [33];
  __sv_type local_128;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_118;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_110 [3];
  size_t local_f8;
  char *local_f0;
  size_t local_d8;
  char *local_d0;
  undefined4 local_c4;
  size_t local_c0;
  char *local_b8;
  __sv_type local_b0;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_true>
  local_a0;
  __sv_type local_98;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_true>
  local_88 [3];
  allocator<char> local_69 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_40;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_38;
  char *local_30;
  mapped_type local_1c;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_30 = in_R9;
  local_1c = in_ESI;
  local_18._M_len = in_RCX;
  local_18._M_str = in_R8;
  if ((generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
       ::emptyString_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                                   ::emptyString_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string(in_stack_fffffffffffff750);
    __cxa_atexit(std::__cxx11::string::~string,
                 &generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                  ::emptyString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                         ::emptyString_abi_cxx11_);
  }
  if (local_1c == UNKNOWN) {
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[8]>(in_stack_fffffffffffff7a8,(char (*) [8])in_stack_fffffffffffff7a0);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
           *)in_stack_fffffffffffff748);
    bVar2 = boost::container::operator!=(&local_38,&local_40);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                 (allocator<char> *)in_stack_fffffffffffff770);
      pbVar5 = boost::container::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                     *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      std::allocator<char>::~allocator(local_69);
      local_48 = pbVar5;
      local_98 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      local_88[0]._M_cur =
           (__node_type *)
           CLI::std::
           unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>_>
           ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>_>
                   *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                  (key_type *)0x200977);
      local_a0._M_cur =
           (__node_type *)
           CLI::std::
           unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>_>
           ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>_>
                  *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      bVar2 = CLI::std::__detail::operator==(local_88,&local_a0);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
        pmVar4 = CLI::std::
                 unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>_>
                 ::at((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>_>
                       *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                      (key_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
        local_1c = *pmVar4;
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                                (char *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738
                                                ));
        if (bVar2) {
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff750,
                     (char *)in_stack_fffffffffffff748);
          _uStack0000000000000008 = local_c0;
          _uStack0000000000000010 = local_b8;
        }
      }
    }
  }
  switch(local_1c) {
  case QUERY:
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                            (char *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                                (char *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738
                                                )), bVar2)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200ce0);
    }
    break;
  case CREATE:
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                            (char *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
    if (bVar2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200b0f);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                              (char *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738))
      ;
      if (bVar2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200b3b);
        local_1c = BARRIER;
      }
      else {
        local_d8 = local_18._M_len;
        local_d0 = local_18._M_str;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff750,
                   (char *)in_stack_fffffffffffff748);
        __x._M_str = (char *)in_stack_fffffffffffff770;
        __x._M_len = (size_t)in_stack_fffffffffffff768;
        __y._M_str = (char *)in_stack_fffffffffffff760;
        __y._M_len = (size_t)in_stack_fffffffffffff758;
        bVar2 = std::operator==(__x,__y);
        if (bVar2) {
          local_1c = BARRIER;
        }
      }
    }
    break;
  case REMOVE:
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                            (char *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                                (char *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738
                                                )), bVar2)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200bf9);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                              (char *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738))
      ;
      if (bVar2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200c25);
        local_1c = CLEAR_BARRIER;
      }
      else {
        local_f8 = local_18._M_len;
        local_f0 = local_18._M_str;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff750,
                   (char *)in_stack_fffffffffffff748);
        __x_00._M_str = (char *)in_stack_fffffffffffff770;
        __x_00._M_len = (size_t)in_stack_fffffffffffff768;
        __y_00._M_str = (char *)in_stack_fffffffffffff760;
        __y_00._M_len = (size_t)in_stack_fffffffffffff758;
        bVar2 = std::operator==(__x_00,__y_00);
        if (bVar2) {
          local_1c = CLEAR_BARRIER;
        }
      }
    }
    break;
  default:
    break;
  case UNKNOWN:
    local_c4 = 0x1f5;
    CLI::std::
    pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<RequestReturnVal,_const_char_(&)[23],_true>
              (in_stack_fffffffffffff770,(RequestReturnVal *)in_stack_fffffffffffff768,
               (char (*) [23])in_stack_fffffffffffff760);
    return in_RDI;
  }
  bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
  local_7a9 = false;
  if (bVar2) {
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[6]>(in_stack_fffffffffffff7a8,(char (*) [6])in_stack_fffffffffffff7a0);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
           *)in_stack_fffffffffffff748);
    local_7a9 = boost::container::operator!=(local_110,&local_118);
  }
  if (local_7a9 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (allocator<char> *)in_stack_fffffffffffff770);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    local_128 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
    _uStack0000000000000008 = local_128._M_len;
    _uStack0000000000000010 = local_128._M_str;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
    std::allocator<char>::~allocator(local_149);
  }
  bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  local_7c9 = false;
  if (bVar2) {
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[7]>(in_stack_fffffffffffff7a8,(char (*) [7])in_stack_fffffffffffff7a0);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
           *)in_stack_fffffffffffff748);
    local_7c9 = boost::container::operator!=(&local_158,&local_160);
  }
  if (local_7c9 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (allocator<char> *)in_stack_fffffffffffff770);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    local_170 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
    local_18._M_len = local_170._M_len;
    local_18._M_str = local_170._M_str;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
    std::allocator<char>::~allocator(local_191);
  }
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200ff3);
  if (bVar2) {
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[7]>(in_stack_fffffffffffff7a8,(char (*) [7])in_stack_fffffffffffff7a0);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
           *)in_stack_fffffffffffff748);
    bVar2 = boost::container::operator!=(&local_1a0,&local_1a8);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                 (allocator<char> *)in_stack_fffffffffffff770);
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
            *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      std::allocator<char>::~allocator(local_1c9);
    }
    else {
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[12]>(in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
             *)in_stack_fffffffffffff748);
      bVar2 = boost::container::operator!=(&local_1d8,&local_1e0);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                   (allocator<char> *)in_stack_fffffffffffff770);
        boost::container::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
        ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
              *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
        std::allocator<char>::~allocator(local_201);
      }
      else {
        boost::container::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
        ::find<char[5]>(in_stack_fffffffffffff7a8,(char (*) [5])in_stack_fffffffffffff7a0);
        boost::container::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
        ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               *)in_stack_fffffffffffff748);
        bVar2 = boost::container::operator!=(&local_210,&local_218);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                     (allocator<char> *)in_stack_fffffffffffff770);
          boost::container::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
          std::allocator<char>::~allocator(local_239);
        }
      }
    }
  }
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20139c);
  if (bVar2) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff750,
               (char *)in_stack_fffffffffffff748);
    __x_01._M_str = (char *)in_stack_fffffffffffff770;
    __x_01._M_len = (size_t)in_stack_fffffffffffff768;
    __y_01._M_str = (char *)in_stack_fffffffffffff760;
    __y_01._M_len = (size_t)in_stack_fffffffffffff758;
    bVar2 = std::operator==(__x_01,__y_01);
    if (bVar2) goto LAB_00201478;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff750,
               (char *)in_stack_fffffffffffff748);
    __x_02._M_str = (char *)in_stack_fffffffffffff770;
    __x_02._M_len = (size_t)in_stack_fffffffffffff768;
    __y_02._M_str = (char *)in_stack_fffffffffffff760;
    __y_02._M_len = (size_t)in_stack_fffffffffffff758;
    bVar2 = std::operator==(__x_02,__y_02);
    if (bVar2) goto LAB_00201478;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                          (char *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  if (bVar2) {
LAB_00201478:
    getBrokerList_abi_cxx11_();
    CLI::std::
    pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
               (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2014b5);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
    return in_RDI;
  }
  std::shared_ptr<helics::Broker>::shared_ptr((shared_ptr<helics::Broker> *)0x2014fc);
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x201509);
  if (bVar2) {
    bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
    if (!bVar2) {
      local_2d8 = local_18._M_len;
      pcStack_2d0 = local_18._M_str;
      brokerName_00._M_str = in_stack_fffffffffffff7b8;
      brokerName_00._M_len = in_stack_fffffffffffff7b0;
      helics::BrokerFactory::findBroker(brokerName_00);
      std::shared_ptr<helics::Broker>::operator=
                ((shared_ptr<helics::Broker> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (shared_ptr<helics::Broker> *)
                 CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x201571);
    }
  }
  else {
    local_2f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
    brokerName_01._M_str = in_stack_fffffffffffff7b8;
    brokerName_01._M_len = in_stack_fffffffffffff7b0;
    helics::BrokerFactory::findBroker(brokerName_01);
    std::shared_ptr<helics::Broker>::operator=
              ((shared_ptr<helics::Broker> *)
               CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
               (shared_ptr<helics::Broker> *)
               CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
    CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x2015ec);
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
  if (!bVar2) {
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[7]>(in_stack_fffffffffffff7a8,(char (*) [7])in_stack_fffffffffffff7a0);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
           *)in_stack_fffffffffffff748);
    bVar2 = boost::container::operator!=(&local_300,&local_308);
    if (bVar2) {
      bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
      if (bVar2) {
        _uStack0000000000000008 = local_18._M_len;
        _uStack0000000000000010 = local_18._M_str;
        local_318 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
        local_18._M_len = local_318._M_len;
        local_18._M_str = local_318._M_str;
      }
      else {
        bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
        if (bVar2) {
          local_328 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
          local_18._M_len = local_328._M_len;
          local_18._M_str = local_328._M_str;
        }
      }
      pcVar10 = local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                 (allocator<char> *)in_stack_fffffffffffff770);
      pbVar5 = boost::container::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                     *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      local_348 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      brokerName_02._M_str = pcVar10;
      brokerName_02._M_len = (size_t)pbVar5;
      helics::BrokerFactory::findBroker(brokerName_02);
      std::shared_ptr<helics::Broker>::operator=
                ((shared_ptr<helics::Broker> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (shared_ptr<helics::Broker> *)
                 CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x2017cf);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      std::allocator<char>::~allocator(local_369);
    }
  }
  pfVar6 = (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
            *)(ulong)(local_1c - CREATE);
  switch(pfVar6) {
  case (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
        *)0x0:
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
    if (bVar2) {
      local_370 = 400;
      std::operator+(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff760);
      CLI::std::
      pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2018c0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      local_394 = 1;
    }
    else {
      std::__cxx11::string::string(in_stack_fffffffffffff750);
      local_3b9 = 0;
      std::__cxx11::string::string(in_stack_fffffffffffff750);
      createBroker(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      std::tie<std::shared_ptr<helics::Broker>,std::__cxx11::string,bool,std::__cxx11::string>
                ((shared_ptr<helics::Broker> *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
                 (bool *)in_stack_fffffffffffff748,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      std::tuple<std::shared_ptr<helics::Broker>&,std::__cxx11::string&,bool&,std::__cxx11::string&>
      ::operator=((tuple<std::shared_ptr<helics::Broker>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                  (tuple<std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      CLI::std::
      tuple<std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple((tuple<std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x201995);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
      if (bVar2) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                     (nullptr_t)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffff760,in_stack_fffffffffffff758);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff750,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff748);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
        if ((local_3b9 & 1) != 0) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff760,in_stack_fffffffffffff758);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff750,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff748);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffff760,in_stack_fffffffffffff758);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff750,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff748);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
        local_4a4 = 0;
        helics::fileops::generateJsonString
                  ((json *)in_stack_fffffffffffff748,(bool)in_stack_fffffffffffff747);
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                   (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738)
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x201bb8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
        local_394 = 1;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      }
      else {
        local_45c = 400;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                   (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738)
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2019ce);
        local_394 = 1;
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
    }
    break;
  case (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
        *)0x1:
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
    if (bVar2) {
      peVar7 = CLI::std::
               __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x201d1f);
      (*peVar7->_vptr_Broker[3])();
      local_4f4 = 0;
      CLI::std::
      pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<RequestReturnVal,_true>
                ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x201d54);
      local_394 = 1;
    }
    else {
      local_4cc = 0x194;
      std::operator+(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff760);
      CLI::std::
      pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x201ccd);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      local_394 = 1;
    }
    break;
  case (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
        *)0x2:
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
    if (!bVar2) {
      helics::BrokerFactory::getConnectedBroker();
      std::shared_ptr<helics::Broker>::operator=
                ((shared_ptr<helics::Broker> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (shared_ptr<helics::Broker> *)
                 CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x201da8);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
      if (!bVar2) {
        local_50c = 0x194;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (in_stack_fffffffffffff770,(RequestReturnVal *)in_stack_fffffffffffff768,
                   (char (*) [24])in_stack_fffffffffffff760);
        local_394 = 1;
        break;
      }
    }
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[5]>(pfVar6,(char (*) [5])in_stack_fffffffffffff7a0);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
           *)in_stack_fffffffffffff748);
    bVar2 = boost::container::operator==(&local_518,&local_520);
    if (bVar2) {
      peVar7 = CLI::std::
               __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x201e4f);
      (*peVar7->_vptr_Broker[0x1b])();
      local_524 = 0;
      CLI::std::
      pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<RequestReturnVal,_true>
                ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x201e87);
      local_394 = 1;
    }
    else {
      pbVar5 = &local_561;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (pbVar5,local_30,(allocator<char> *)in_stack_fffffffffffff770);
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
            *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      local_540 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      timeString._M_len._7_1_ = in_stack_fffffffffffff747;
      timeString._M_len._0_7_ = in_stack_fffffffffffff740;
      timeString._M_str = (char *)in_stack_fffffffffffff748;
      local_530 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                            (timeString);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      std::allocator<char>::~allocator((allocator<char> *)&local_561);
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>=
                        (&local_530,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
      if (bVar2) {
        peVar7 = CLI::std::
                 __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x201f73);
        local_570 = local_530.internalTimeCode;
        (*peVar7->_vptr_Broker[0x1a])(peVar7,local_530.internalTimeCode);
      }
      else {
        peVar7 = CLI::std::
                 __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x201ff4);
        (*peVar7->_vptr_Broker[0x1b])();
      }
      local_574 = 0;
      CLI::std::
      pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<RequestReturnVal,_true>
                ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20202e);
      local_394 = 1;
    }
    break;
  case (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
        *)0x3:
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
    if (!bVar2) {
      helics::BrokerFactory::getConnectedBroker();
      std::shared_ptr<helics::Broker>::operator=
                ((shared_ptr<helics::Broker> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (shared_ptr<helics::Broker> *)
                 CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x202379);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
      if (!bVar2) {
        local_634 = 0x194;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (in_stack_fffffffffffff770,(RequestReturnVal *)in_stack_fffffffffffff768,
                   (char (*) [24])in_stack_fffffffffffff760);
        local_394 = 1;
        break;
      }
    }
    peVar7 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2023d2);
    (*peVar7->_vptr_Broker[0x1b])();
    local_638 = 0;
    CLI::std::
    pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<RequestReturnVal,_true>
              ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
               (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20240a);
    local_394 = 1;
    break;
  case (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
        *)0x4:
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
    if (!bVar2) {
      helics::BrokerFactory::getConnectedBroker();
      std::shared_ptr<helics::Broker>::operator=
                ((shared_ptr<helics::Broker> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (shared_ptr<helics::Broker> *)
                 CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x202082);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
      if (!bVar2) {
        local_58c = 0x194;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (in_stack_fffffffffffff770,(RequestReturnVal *)in_stack_fffffffffffff768,
                   (char (*) [24])in_stack_fffffffffffff760);
        local_394 = 1;
        break;
      }
    }
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[12]>(pfVar6,in_stack_fffffffffffff7a0);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
           *)in_stack_fffffffffffff748);
    bVar2 = boost::container::operator!=(&local_598,&local_5a0);
    if (bVar2) {
      pfVar6 = (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                *)CLI::std::
                  __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x20212c);
      local_5b8 = local_18._M_len;
      pcStack_5b0 = local_18._M_str;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                 (allocator<char> *)in_stack_fffffffffffff770);
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::at(pfVar6,in_stack_fffffffffffff748);
      local_5c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      (**(code **)((long)&(pfVar6->m_flat_tree).m_data.m_seq.m_holder.m_start[2].first.field_2 + 8))
                (pfVar6,local_5b8,pcStack_5b0,local_5c8._M_len,local_5c8._M_str,0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      std::allocator<char>::~allocator(local_5e9);
    }
    else {
      bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
      if (bVar2) {
        local_61c = 400;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (in_stack_fffffffffffff770,(RequestReturnVal *)in_stack_fffffffffffff768,
                   (char (*) [24])in_stack_fffffffffffff760);
        local_394 = 1;
        break;
      }
      peVar7 = CLI::std::
               __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x20226a);
      local_608 = local_18._M_len;
      pcStack_600 = local_18._M_str;
      local_618 = uStack0000000000000008;
      uStack_614 = uStack000000000000000c;
      uStack_610 = uStack0000000000000010;
      uStack_60c = uStack0000000000000014;
      (*peVar7->_vptr_Broker[0x13])
                (peVar7,local_18._M_len,local_18._M_str,_uStack0000000000000008,
                 _uStack0000000000000010,0);
    }
    local_620 = 0;
    CLI::std::
    pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<RequestReturnVal,_true>
              ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
               (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x202325);
    local_394 = 1;
    break;
  default:
    local_639 = 0;
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
    if (bVar2) {
      bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
      if ((bVar2) &&
         (bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18),
         !bVar2)) {
        _uStack0000000000000008 = local_18._M_len;
        _uStack0000000000000010 = local_18._M_str;
        local_639 = 1;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff750,
                   (char *)in_stack_fffffffffffff748);
        local_18._M_len = local_6a8;
        local_18._M_str = local_6a0;
      }
    }
    else {
      helics::BrokerFactory::getConnectedBroker();
      std::shared_ptr<helics::Broker>::operator=
                ((shared_ptr<helics::Broker> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (shared_ptr<helics::Broker> *)
                 CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x20246c);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
      if (!bVar2) {
        local_654 = 0x194;
        std::operator+(in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff760);
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                   (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738)
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2024c7);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
        local_394 = 1;
        break;
      }
      bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
      if (bVar2) {
        local_688 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
        _uStack0000000000000008 = local_688._M_len;
        _uStack0000000000000010 = local_688._M_str;
      }
      else {
        _uStack0000000000000008 = local_18._M_len;
        _uStack0000000000000010 = local_18._M_str;
        local_698 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
        local_18._M_len = local_698._M_len;
        local_18._M_str = local_698._M_str;
      }
    }
    bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
    if (bVar2) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff750,
                 (char *)in_stack_fffffffffffff748);
      local_18._M_len = local_6b8;
      local_18._M_str = local_6b0;
    }
    bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
    if (bVar2) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff750,
                 (char *)in_stack_fffffffffffff748);
      _uStack0000000000000008 = local_6c8;
      _uStack0000000000000010 = local_6c0;
    }
    peVar7 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2026dc);
    local_6f8 = local_18._M_len;
    pcStack_6f0 = local_18._M_str;
    local_708 = uStack0000000000000008;
    uStack_704 = uStack000000000000000c;
    uStack_700 = uStack0000000000000010;
    uStack_6fc = uStack0000000000000014;
    uVar9 = 0;
    (*peVar7->_vptr_Broker[0x11])
              (local_6e8,peVar7,local_18._M_len,local_18._M_str,_uStack0000000000000008,
               _uStack0000000000000010);
    sVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758,
                 (size_type)in_stack_fffffffffffff750);
    if (sVar8 == 0xffffffffffffffff) {
      local_70c = 0;
      CLI::std::
      pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,uVar9),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x202787);
    }
    else if ((local_639 & 1) == 0) {
      CLI::std::
      pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<RequestReturnVal,_const_char_(&)[21],_true>
                (in_stack_fffffffffffff770,(RequestReturnVal *)in_stack_fffffffffffff768,
                 (char (*) [21])in_stack_fffffffffffff760);
    }
    else {
      peVar7 = CLI::std::
               __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2027da);
      pcVar10 = _uStack0000000000000010;
      sVar1 = _uStack0000000000000008;
      in_stack_fffffffffffff740 = SUB87(peVar7,0);
      in_stack_fffffffffffff747 = (undefined1)((ulong)peVar7 >> 0x38);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff750,
                 (char *)in_stack_fffffffffffff748);
      uVar9 = 0;
      (**(code **)(*(long *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740) + 0x88))
                (local_730,(long *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                 sVar1,pcVar10,local_758,local_750);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
      sVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find(in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758,
                   (size_type)in_stack_fffffffffffff750);
      if (sVar8 == 0xffffffffffffffff) {
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740),
                   (RequestReturnVal *)CONCAT44(in_stack_fffffffffffff73c,uVar9),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2028eb);
      }
      else {
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[17],_true>
                  (in_stack_fffffffffffff770,(RequestReturnVal *)in_stack_fffffffffffff768,
                   (char (*) [17])in_stack_fffffffffffff760);
      }
    }
    local_394 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff747,in_stack_fffffffffffff740));
  }
  CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x202948);
  return in_RDI;
}

Assistant:

static std::pair<RequestReturnVal, std::string>
    generateResults(RestCommand command,
                    std::string brokerName,
                    std::string_view target,
                    std::string_view query,
                    const boost::container::flat_map<std::string, std::string>& fields)
{
    static const std::string emptyString;
    if (command == RestCommand::UNKNOWN) {
        if (fields.find("command") != fields.end()) {
            const auto& cmdstr = fields.at("command");
            if (commandMap.find(cmdstr) != commandMap.end()) {
                command = commandMap.at(cmdstr);
                if (cmdstr == "status") {
                    query = "status";
                }
            }
        }
    }
    switch (command) {
        case RestCommand::UNKNOWN:
            return {RequestReturnVal::NOT_IMPLEMENTED, "command not recognized"};
        case RestCommand::CREATE:
            if (brokerName == "create") {
                brokerName.clear();
                break;
            }
            if (brokerName == "barrier") {
                brokerName.clear();
                command = RestCommand::BARRIER;
                break;
            }
            if (target == "barrier") {
                command = RestCommand::BARRIER;
            }
            break;
        case RestCommand::REMOVE:
            if (brokerName == "delete" || brokerName == "remove") {
                brokerName.clear();
                break;
            }
            if (brokerName == "barrier") {
                brokerName.clear();
                command = RestCommand::CLEAR_BARRIER;
                break;
            }
            if (target == "barrier") {
                command = RestCommand::CLEAR_BARRIER;
            }
            break;
        case RestCommand::QUERY:
            if (brokerName == "query" || brokerName == "search") {
                brokerName.clear();
            }
            break;
        default:
            break;
    }

    if (query.empty() && fields.find("query") != fields.end()) {
        query = fields.at("query");
    }
    if (target.empty() && fields.find("target") != fields.end()) {
        target = fields.at("target");
    }
    if (brokerName.empty()) {
        if (fields.find("broker") != fields.end()) {
            brokerName = fields.at("broker");
        } else if (fields.find("broker_uuid") != fields.end()) {
            brokerName = fields.at("broker_uuid");
        } else if (fields.find("uuid") != fields.end()) {
            brokerName = fields.at("uuid");
        }
    }
    if ((brokerName.empty() && (target == "brokers" || query == "brokers")) ||
        brokerName == "brokers") {
        return {RequestReturnVal::OK, getBrokerList()};
    }

    std::shared_ptr<helics::Broker> brkr;
    if (brokerName.empty()) {
        if (!target.empty()) {
            brkr = helics::BrokerFactory::findBroker(target);
        }
    } else {
        brkr = helics::BrokerFactory::findBroker(brokerName);
    }

    if (!brkr) {
        if (fields.find("broker") != fields.end()) {
            if (query.empty()) {
                query = target;
                target = brokerName;
            } else if (target.empty()) {
                target = brokerName;
            }
            brkr = helics::BrokerFactory::findBroker(fields.at("broker"));
        }
    }
    switch (command) {
        case RestCommand::CREATE: {
            if (brkr) {
                return {RequestReturnVal::BAD_REQUEST, brokerName + " already exists"};
            }
            std::string errorMessage;
            bool useUuid{false};
            std::string type;
            std::tie(brkr, errorMessage, useUuid, type) = createBroker(brokerName, fields);

            if (!brkr) {
                return {RequestReturnVal::BAD_REQUEST, errorMessage};
            }
            nlohmann::json retJson;
            retJson["broker"] = brokerName;
            if (useUuid) {
                retJson["broker_uuid"] = brokerName;
            }
            retJson["type"] = type;
            return {RequestReturnVal::OK, helics::fileops::generateJsonString(retJson)};
        }
        case RestCommand::REMOVE:
            if (!brkr) {
                return {RequestReturnVal::NOT_FOUND, brokerName + " not found"};
            }
            brkr->disconnect();
            return {RequestReturnVal::OK, emptyString};
        case RestCommand::BARRIER: {
            if (!brkr) {
                brkr = helics::BrokerFactory::getConnectedBroker();
                if (!brkr) {
                    return {RequestReturnVal::NOT_FOUND, "unable to locate broker"};
                }
            }
            if (fields.find("time") == fields.end()) {
                brkr->clearTimeBarrier();
                return {RequestReturnVal::OK, emptyString};
            }
            auto bTime = gmlc::utilities::loadTimeFromString<helics::Time>(fields.at("time"));
            if (bTime >= helics::timeZero) {
                brkr->setTimeBarrier(bTime);
            } else {
                brkr->clearTimeBarrier();
            }
            return {RequestReturnVal::OK, emptyString};
        }
        case RestCommand::COMMAND:
            if (!brkr) {
                brkr = helics::BrokerFactory::getConnectedBroker();
                if (!brkr) {
                    return {RequestReturnVal::NOT_FOUND, "unable to locate broker"};
                }
            }
            if (fields.find("command_str") != fields.end()) {
                brkr->sendCommand(target, fields.at("command_str"));
            } else if (!query.empty()) {
                brkr->sendCommand(target, query);
            } else {
                return {RequestReturnVal::BAD_REQUEST, "no valid command string"};
            }
            return {RequestReturnVal::OK, emptyString};
        case RestCommand::CLEAR_BARRIER:
            if (!brkr) {
                brkr = helics::BrokerFactory::getConnectedBroker();
                if (!brkr) {
                    return {RequestReturnVal::NOT_FOUND, "unable to locate broker"};
                }
            }

            brkr->clearTimeBarrier();
            return {RequestReturnVal::OK, emptyString};
        default:
            break;
    }  // end switch

    bool autoquery{false};
    if (!brkr) {
        brkr = helics::BrokerFactory::getConnectedBroker();
        if (!brkr) {
            return {RequestReturnVal::NOT_FOUND, brokerName + " not found and no valid brokers"};
        }
        if (target.empty()) {
            query = brokerName;
        } else {
            query = target;
            target = brokerName;
        }

    } else if (query.empty() && !target.empty()) {
        query = target;
        autoquery = true;
        target = "root";
    }
    if (target.empty()) {
        target = "root";
    }
    if (query.empty()) {
        query = "current_state";
    }
    auto res = brkr->query(target, query);
    if (res.find("\"error\"") == std::string::npos) {
        return {RequestReturnVal::OK, res};
    }

    if (autoquery) {
        res = brkr->query(query, "current_state");
        if (res.find("\"error\"") != std::string::npos) {
            return {RequestReturnVal::NOT_FOUND, "target not found"};
        }
        return {RequestReturnVal::OK, res};
    }
    return {RequestReturnVal::NOT_FOUND, "query not recognized"};
}